

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.cpp
# Opt level: O1

Error __thiscall asmjit::VMemMgr::release(VMemMgr *this,void *p)

{
  uint8_t *puVar1;
  size_t sVar2;
  uint8_t *puVar3;
  RbNode *pRVar4;
  RbNode *pRVar5;
  size_t sVar6;
  int iVar7;
  ulong uVar8;
  size_t *psVar9;
  MemNode *pMVar10;
  long lVar11;
  MemNode *pMVar12;
  MemNode *pMVar13;
  uint uVar14;
  size_t *psVar15;
  Error EVar16;
  ulong uVar17;
  MemNode **ppMVar18;
  MemNode *__ptr;
  size_t sVar19;
  ulong uVar20;
  RbNode *save;
  RbNode **ppRVar21;
  RbNode *pRVar22;
  MemNode *pMVar23;
  MemNode *pMVar24;
  bool bVar25;
  RbNode local_58;
  
  if (p == (void *)0x0) {
    return 0;
  }
  pthread_mutex_lock((pthread_mutex_t *)this);
  pMVar24 = this->_root;
  do {
    if (pMVar24 == (MemNode *)0x0) {
      pMVar24 = (MemNode *)0x0;
      break;
    }
    puVar1 = (pMVar24->super_RbNode).mem;
    if (p < puVar1) {
LAB_001743b3:
      pMVar24 = (MemNode *)(pMVar24->super_RbNode).node[0];
      bVar25 = true;
    }
    else {
      if (puVar1 + pMVar24->size <= p) {
        pMVar24 = (MemNode *)((pMVar24->super_RbNode).node + 1);
        goto LAB_001743b3;
      }
      bVar25 = false;
    }
  } while (bVar25);
  if (pMVar24 != (MemNode *)0x0) {
    puVar1 = (pMVar24->super_RbNode).mem;
    lVar11 = 0;
    uVar8 = (ulong)((long)p - (long)puVar1) / pMVar24->density;
    uVar17 = 1L << (uVar8 & 0x3f);
    uVar8 = uVar8 >> 6;
    psVar15 = pMVar24->baUsed + uVar8;
    psVar9 = pMVar24->baCont + uVar8;
    do {
      sVar19 = *psVar15;
      sVar2 = *psVar9;
      do {
        uVar20 = sVar2;
        uVar8 = uVar17;
        sVar19 = ~uVar8 & sVar19;
        lVar11 = lVar11 + 1;
        if ((uVar8 & uVar20) == 0) break;
        uVar17 = uVar8 * 2;
        sVar2 = ~uVar8 & uVar20;
      } while (uVar8 * 2 != 0);
      *psVar15 = sVar19;
      *psVar9 = ~uVar8 & uVar20;
      if ((uVar8 & uVar20) == 0) goto LAB_00174444;
      psVar15 = psVar15 + 1;
      psVar9 = psVar9 + 1;
      uVar17 = 1;
    } while( true );
  }
  EVar16 = 3;
  goto LAB_00174771;
LAB_00174444:
  sVar19 = pMVar24->size;
  sVar2 = pMVar24->used;
  if (sVar2 == sVar19) {
    pMVar13 = this->_optimal;
    do {
      pMVar13 = pMVar13->prev;
      if (pMVar13 == pMVar24) {
        this->_optimal = pMVar24;
        break;
      }
    } while (pMVar13 != (MemNode *)0x0);
  }
  uVar17 = lVar11 * pMVar24->density;
  if (pMVar24->largestBlock < uVar17) {
    pMVar24->largestBlock = uVar17;
  }
  pMVar24->used = sVar2 - uVar17;
  this->_usedBytes = this->_usedBytes - uVar17;
  if (sVar2 != uVar17) {
LAB_0017476f:
    EVar16 = 0;
LAB_00174771:
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return EVar16;
  }
  OSUtils::releaseVirtualMemory(puVar1,sVar19);
  free(pMVar24->baUsed);
  pMVar24->baUsed = (size_t *)0x0;
  pMVar24->baCont = (size_t *)0x0;
  this->_allocatedBytes = this->_allocatedBytes - pMVar24->size;
  pMVar13 = this->_root;
  local_58 = (RbNode)(ZEXT832(pMVar13) << 0x40);
  if (pMVar13 == (MemNode *)0x0) {
    __ptr = (MemNode *)&stack0xffffffffffffffa8;
    pMVar12 = (MemNode *)0x0;
    pMVar10 = (MemNode *)0x0;
  }
  else {
    ppRVar21 = (RbNode **)((long)register0x00000020 + -0x50);
    uVar8 = 1;
    pMVar12 = (MemNode *)0x0;
    uVar17 = 1;
    __ptr = (MemNode *)&stack0xffffffffffffffa8;
    pMVar23 = (MemNode *)0x0;
    do {
      pMVar10 = __ptr;
      __ptr = pMVar13;
      puVar1 = (__ptr->super_RbNode).mem;
      puVar3 = (pMVar24->super_RbNode).mem;
      if (__ptr == pMVar24) {
        pMVar12 = __ptr;
      }
      if ((__ptr->super_RbNode).red == 0) {
        bVar25 = puVar1 < puVar3;
        pRVar22 = (__ptr->super_RbNode).node[bVar25];
        if ((pRVar22 == (RbNode *)0x0) || (pRVar22->red == 0)) {
          pMVar13 = (MemNode *)(__ptr->super_RbNode).node[puVar3 <= puVar1];
          if ((pMVar13 == (MemNode *)0x0) || ((pMVar13->super_RbNode).red == 0)) {
            uVar14 = (uint)uVar17 ^ 1;
            pRVar22 = (pMVar10->super_RbNode).node[uVar14];
            if (pRVar22 != (RbNode *)0x0) {
              pRVar4 = pRVar22->node[uVar14];
              if (((pRVar4 == (RbNode *)0x0) || (pRVar4->red == 0)) &&
                 ((pRVar22->node[uVar8] == (RbNode *)0x0 || (pRVar22->node[uVar8]->red == 0)))) {
                (pMVar10->super_RbNode).red = 0;
                pRVar22->red = 1;
                (__ptr->super_RbNode).red = 1;
              }
              else {
                pMVar13 = (MemNode *)(pMVar23->super_RbNode).node[1];
                pRVar5 = pRVar22->node[uVar8];
                if ((pRVar5 == (RbNode *)0x0) || (pRVar5->red == 0)) {
                  if ((pRVar4 != (RbNode *)0x0) && (pRVar4->red != 0)) {
                    (pMVar10->super_RbNode).node[uVar14] = pRVar5;
                    pRVar22->node[uVar8] = &pMVar10->super_RbNode;
                    (pMVar10->super_RbNode).red = 1;
                    goto LAB_00174640;
                  }
                }
                else {
                  pRVar4 = pRVar22->node[uVar17];
                  pRVar22->node[uVar17] = pRVar4->node[uVar14];
                  pRVar4->node[uVar14] = pRVar22;
                  pRVar22->red = 1;
                  pRVar4->red = 0;
                  (pMVar10->super_RbNode).node[uVar14] = pRVar4;
                  (pMVar10->super_RbNode).node[uVar14] = pRVar4->node[uVar8];
                  pRVar4->node[uVar8] = &pMVar10->super_RbNode;
                  (pMVar10->super_RbNode).red = 1;
                  pRVar22 = pRVar4;
LAB_00174640:
                  pRVar22->red = 0;
                  (pMVar23->super_RbNode).node[pMVar13 == pMVar10] = pRVar22;
                }
                pRVar22 = (pMVar23->super_RbNode).node[pMVar13 == pMVar10];
                pRVar22->red = 1;
                (__ptr->super_RbNode).red = 1;
                pRVar22->node[0]->red = 0;
                pRVar22->node[1]->red = 0;
              }
            }
          }
          else {
            (__ptr->super_RbNode).node[puVar3 <= puVar1] = (pMVar13->super_RbNode).node[bVar25];
            (pMVar13->super_RbNode).node[bVar25] = &__ptr->super_RbNode;
            (__ptr->super_RbNode).red = 1;
            (pMVar13->super_RbNode).red = 0;
            *ppRVar21 = (RbNode *)pMVar13;
            pMVar10 = pMVar13;
          }
        }
      }
      uVar17 = (ulong)(puVar1 < puVar3);
      uVar8 = (ulong)(puVar1 < puVar3);
      ppRVar21 = (__ptr->super_RbNode).node + uVar8;
      pMVar13 = (MemNode *)*ppRVar21;
      pMVar23 = pMVar10;
    } while ((MemNode *)*ppRVar21 != (MemNode *)0x0);
  }
  if (pMVar12 == (MemNode *)0x0) {
    release();
LAB_00174792:
    release();
  }
  else {
    if (pMVar12 == (MemNode *)&stack0xffffffffffffffa8) goto LAB_00174792;
    if (__ptr != (MemNode *)&stack0xffffffffffffffa8) {
      if (pMVar12 != __ptr) {
        (pMVar12->super_RbNode).mem = (__ptr->super_RbNode).mem;
        sVar19 = __ptr->used;
        sVar2 = __ptr->blocks;
        sVar6 = __ptr->density;
        pMVar12->size = __ptr->size;
        pMVar12->used = sVar19;
        pMVar12->blocks = sVar2;
        pMVar12->density = sVar6;
        pMVar12->largestBlock = __ptr->largestBlock;
        psVar9 = __ptr->baCont;
        pMVar12->baUsed = __ptr->baUsed;
        pMVar12->baCont = psVar9;
      }
      (pMVar10->super_RbNode).node[(MemNode *)(pMVar10->super_RbNode).node[1] == __ptr] =
           (__ptr->super_RbNode).node[(__ptr->super_RbNode).node[0] == (RbNode *)0x0];
      this->_root = (MemNode *)local_58.node[1];
      if ((MemNode *)local_58.node[1] != (MemNode *)0x0) {
        (((MemNode *)local_58.node[1])->super_RbNode).red = 0;
      }
      pMVar24 = __ptr->prev;
      pMVar13 = __ptr->next;
      ppMVar18 = &pMVar24->next;
      if (pMVar24 == (MemNode *)0x0) {
        ppMVar18 = &this->_first;
      }
      *ppMVar18 = pMVar13;
      ppMVar18 = &pMVar13->prev;
      if (pMVar13 == (MemNode *)0x0) {
        ppMVar18 = &this->_last;
      }
      *ppMVar18 = pMVar24;
      if (this->_optimal == __ptr) {
        if (pMVar24 != (MemNode *)0x0) {
          pMVar13 = pMVar24;
        }
        this->_optimal = pMVar13;
      }
      free(__ptr);
      iVar7 = rbAssert(&this->_root->super_RbNode);
      if (iVar7 < 1) goto LAB_001747a2;
      goto LAB_0017476f;
    }
  }
  release();
LAB_001747a2:
  release();
}

Assistant:

Error VMemMgr::release(void* p) noexcept {
  if (!p) return kErrorOk;

  AutoLock locked(_lock);
  MemNode* node = vMemMgrFindNodeByPtr(this, static_cast<uint8_t*>(p));
  if (!node) return DebugUtils::errored(kErrorInvalidArgument);

  size_t offset = (size_t)((uint8_t*)p - (uint8_t*)node->mem);
  size_t bitpos = M_DIV(offset, node->density);
  size_t i = (bitpos / kBitsPerEntity);

  size_t* up = node->baUsed + i;  // Current ubits address.
  size_t* cp = node->baCont + i;  // Current cbits address.
  size_t ubits = *up;             // Current ubits[0] value.
  size_t cbits = *cp;             // Current cbits[0] value.
  size_t bit = (size_t)1 << (bitpos % kBitsPerEntity);

  size_t cont = 0;
  bool stop;

  for (;;) {
    stop = (cbits & bit) == 0;
    ubits &= ~bit;
    cbits &= ~bit;

    bit <<= 1;
    cont++;

    if (stop || bit == 0) {
      *up = ubits;
      *cp = cbits;
      if (stop)
        break;

      ubits = *++up;
      cbits = *++cp;
      bit = 1;
    }
  }

  // If the freed block is fully allocated node then it's needed to
  // update 'optimal' pointer in memory manager.
  if (node->used == node->size) {
    MemNode* cur = _optimal;

    do {
      cur = cur->prev;
      if (cur == node) {
        _optimal = node;
        break;
      }
    } while (cur);
  }

  // Statistics.
  cont *= node->density;
  if (node->largestBlock < cont)
    node->largestBlock = cont;

  node->used -= cont;
  _usedBytes -= cont;

  // If page is empty, we can free it.
  if (node->used == 0) {
    // Free memory associated with node (this memory is not accessed
    // anymore so it's safe).
    vMemMgrReleaseVMem(this, node->mem, node->size);
    Internal::releaseMemory(node->baUsed);

    node->baUsed = nullptr;
    node->baCont = nullptr;

    // Statistics.
    _allocatedBytes -= node->size;

    // Remove node. This function can return different node than
    // passed into, but data is copied into previous node if needed.
    Internal::releaseMemory(vMemMgrRemoveNode(this, node));
    ASMJIT_ASSERT(vMemMgrCheckTree(this));
  }

  return kErrorOk;
}